

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O2

axl_va_list * __thiscall
axl::sl::PackStringBase<char>::operator()
          (axl_va_list *__return_storage_ptr__,PackStringBase<char> *this,void *p,size_t *size,
          axl_va_list *va)

{
  undefined8 uVar1;
  char *p_00;
  size_t sVar2;
  
  p_00 = axl_va_list::arg<char*>(va);
  sVar2 = StringDetailsBase<char>::calcLength(p_00);
  *size = sVar2 + 1;
  if (p != (void *)0x0) {
    if (p_00 == (char *)0x0) {
      *(undefined8 *)p = 0;
    }
    else {
      __wrap_memcpy(p,p_00,sVar2 + 1);
    }
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar1 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		T* string = va.arg<T*> ();

		size_t length = StringDetailsBase<T>::calcLength(string);
		size_t stringSize = (length + 1) * sizeof(T);

		*size = stringSize;

		if (p) {
			if (string)
				memcpy(p, string, stringSize);
			else
				*(T**)p = NULL;
		}

		return va;
	}